

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextVoid(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  ImGuiID id_00;
  ImGuiWindow *pIVar2;
  int mouse_button;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext_conflict *g;
  char *pcStack_10;
  ImGuiPopupFlags popup_flags_local;
  char *str_id_local;
  
  pcStack_10 = str_id;
  if (str_id == (char *)0x0) {
    pcStack_10 = "void_context";
  }
  id_00 = ImGuiWindow::GetID(GImGui->CurrentWindow,pcStack_10,(char *)0x0);
  bVar1 = IsMouseReleased(popup_flags & 0x1f);
  if (((bVar1) && (bVar1 = IsWindowHovered(4), !bVar1)) &&
     (pIVar2 = GetTopMostPopupModal(), pIVar2 == (ImGuiWindow *)0x0)) {
    OpenPopupEx(id_00,popup_flags);
  }
  bVar1 = BeginPopupEx(id_00,0x141);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextVoid(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!str_id)
        str_id = "void_context";
    ImGuiID id = window->GetID(str_id);
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && !IsWindowHovered(ImGuiHoveredFlags_AnyWindow))
        if (GetTopMostPopupModal() == NULL)
            OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}